

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_common.cpp
# Opt level: O2

bool dxil_spv::extract_raw_buffer_access_split
               (Value *index,uint stride,uint32_t addr_shift_log2,uint vecsize,
               RawBufferAccessSplit *split)

{
  bool bVar1;
  bool bVar2;
  BinaryOps BVar3;
  Constant *pCVar4;
  APInt *pAVar5;
  int64_t iVar6;
  BinaryOperator *this;
  Value *value;
  Constant *pCVar7;
  uint64_t uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  uint64_t uVar13;
  uint uVar14;
  ulong uVar15;
  Value *value_00;
  bool bVar16;
  
  uVar14 = vecsize << ((byte)addr_shift_log2 & 0x1f);
  pCVar4 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(index)->super_Constant;
  if (pCVar4 != (Constant *)0x0) {
    pAVar5 = LLVMBC::Constant::getUniqueInteger(pCVar4);
    iVar6 = LLVMBC::APInt::getSExtValue(pAVar5);
    if ((vecsize != 1) && ((long)((ulong)stride * iVar6) % (long)(int)uVar14 != 0)) {
      return false;
    }
    split->dynamic_index = (Value *)0x0;
    split->scale = 0;
    split->bias = 0;
    split->bias = (long)((ulong)stride * iVar6) / (long)(ulong)uVar14;
    return true;
  }
  bVar16 = false;
  bVar2 = false;
  lVar12 = 0;
  pCVar4 = (Constant *)0x0;
  do {
    pCVar7 = (Constant *)0x0;
    lVar10 = lVar12;
LAB_001429be:
    value_00 = index;
    lVar12 = lVar10;
    if (pCVar7 != (Constant *)0x0) {
      pAVar5 = LLVMBC::Constant::getUniqueInteger(pCVar7);
      uVar8 = LLVMBC::APInt::getZExtValue(pAVar5);
      uVar13 = 1L << ((byte)uVar8 & 0x3f);
      if (lVar12 == 0) {
        uVar13 = uVar8;
      }
      if (pCVar4 != (Constant *)0x0) goto LAB_00142b2e;
      uVar9 = 0;
      goto LAB_00142b47;
    }
    bVar1 = LLVMBC::isa<LLVMBC::BinaryOperator>(value_00);
    if (!bVar1) goto LAB_00142af0;
    this = LLVMBC::cast<LLVMBC::BinaryOperator>(value_00);
    value = LLVMBC::Instruction::getOperand(&this->super_Instruction,0);
    index = LLVMBC::Instruction::getOperand(&this->super_Instruction,1);
    if ((pCVar4 != (Constant *)0x0) ||
       ((((BVar3 = LLVMBC::BinaryOperator::getOpcode(this), BVar3 != Add &&
          (BVar3 = LLVMBC::BinaryOperator::getOpcode(this), BVar3 != Sub)) &&
         (BVar3 = LLVMBC::BinaryOperator::getOpcode(this), BVar3 != Or)) &&
        (BVar3 = LLVMBC::BinaryOperator::getOpcode(this), BVar3 != Xor)))) {
      BVar3 = LLVMBC::BinaryOperator::getOpcode(this);
      if (BVar3 == Shl) {
        pCVar7 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(index)->super_Constant;
        lVar10 = 1;
        goto LAB_00142a8f;
      }
      BVar3 = LLVMBC::BinaryOperator::getOpcode(this);
      if (BVar3 == Mul) break;
      goto LAB_00142af0;
    }
    pCVar7 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(value)->super_Constant;
    if ((pCVar7 == (Constant *)0x0) &&
       (pCVar7 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(index)->super_Constant, index = value,
       pCVar7 == (Constant *)0x0)) {
LAB_00142af0:
      if (pCVar4 == (Constant *)0x0) {
        if (stride % uVar14 == 0) {
          split->bias = 0;
          split->scale = (ulong)stride / (ulong)uVar14;
          split->dynamic_index = value_00;
          return true;
        }
        return false;
      }
      uVar13 = lVar12 + 1;
LAB_00142b2e:
      pAVar5 = LLVMBC::Constant::getUniqueInteger(pCVar4);
      uVar9 = LLVMBC::APInt::getSExtValue(pAVar5);
LAB_00142b47:
      uVar11 = -uVar9;
      if (!bVar16) {
        uVar11 = uVar9;
      }
      if (!bVar2 && (uVar11 & uVar13) != 0) {
        return false;
      }
      uVar9 = uVar13 * stride;
      uVar15 = (ulong)uVar14;
      if (uVar9 % uVar15 != 0) {
        return false;
      }
      lVar12 = uVar11 * stride;
      if (lVar12 % (long)uVar15 == 0) {
        if (value_00 != (Value *)0x0) {
          split->scale = uVar9 / uVar15;
          split->bias = lVar12 / (long)(int)uVar14;
          split->dynamic_index = value_00;
          return true;
        }
        return false;
      }
      return false;
    }
    BVar3 = LLVMBC::BinaryOperator::getOpcode(this);
    bVar16 = BVar3 == Sub;
    BVar3 = LLVMBC::BinaryOperator::getOpcode(this);
    bVar2 = BVar3 == Add || bVar16;
    pCVar4 = pCVar7;
  } while( true );
  pCVar7 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(value)->super_Constant;
  lVar10 = 0;
  if (pCVar7 == (Constant *)0x0) {
    pCVar7 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(index)->super_Constant;
    lVar10 = 0;
LAB_00142a8f:
    index = value;
    if (pCVar7 == (Constant *)0x0) goto LAB_00142af0;
  }
  goto LAB_001429be;
}

Assistant:

bool extract_raw_buffer_access_split(const llvm::Value *index, unsigned stride,
                                     uint32_t addr_shift_log2, unsigned vecsize,
                                     RawBufferAccessSplit &split)
{
	unsigned element_size = (1u << addr_shift_log2) * vecsize;

	// Base case first, a constant value.
	if (const auto *const_addr = llvm::dyn_cast<llvm::ConstantInt>(index))
	{
		int64_t constant_offset = const_addr->getUniqueInteger().getSExtValue();
		constant_offset *= stride;

		// Always pass scalar constant dividers through.
		// Building a fallback divider helps nothing.
		if (vecsize == 1 || constant_offset % int(element_size) == 0)
		{
			split = {};
			split.bias = constant_offset / element_size;
			return true;
		}
		else
			return false;
	}

	const llvm::ConstantInt *scale = nullptr;
	const llvm::ConstantInt *bias = nullptr;
	bool scale_log2 = false;
	bool bias_is_add = false;
	bool bias_negate = false;

	while (!scale && llvm::isa<llvm::BinaryOperator>(index))
	{
		auto *binop = llvm::cast<llvm::BinaryOperator>(index);
		auto *lhs = binop->getOperand(0);
		auto *rhs = binop->getOperand(1);
		if (!bias && (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Add ||
		              binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Sub ||
		              binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Or ||
		              binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Xor))
		{
			if (const auto *const_lhs = llvm::dyn_cast<llvm::ConstantInt>(lhs))
			{
				bias = const_lhs;
				index = rhs;
			}
			else if (const auto *const_rhs = llvm::dyn_cast<llvm::ConstantInt>(rhs))
			{
				bias = const_rhs;
				index = lhs;
			}
			else
				break;

			// DXC tends to be emit shift + or in some cases.
			// We can turn this back into mul + add in most cases.
			bias_negate = binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Sub;
			bias_is_add =
					binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Add ||
					bias_negate;
		}
		else if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Shl)
		{
			if (const auto *const_rhs = llvm::dyn_cast<llvm::ConstantInt>(rhs))
			{
				scale = const_rhs;
				index = lhs;
			}
			else
				break;

			scale_log2 = true;
		}
		else if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Mul)
		{
			if (const auto *const_lhs = llvm::dyn_cast<llvm::ConstantInt>(lhs))
			{
				scale = const_lhs;
				index = rhs;
			}
			else if (const auto *const_rhs = llvm::dyn_cast<llvm::ConstantInt>(rhs))
			{
				scale = const_rhs;
				index = lhs;
			}
			else
				break;

			scale_log2 = false;
		}
		else
			break;
	}

	if (!scale && !bias)
	{
		// We cannot split anything, but we might be able to vectorize if the stride alone carries us.
		if (stride % element_size == 0)
		{
			split = {};
			split.scale = stride / element_size;
			split.dynamic_index = index;
			return true;
		}
		else
			return false;
	}

	uint64_t scale_factor = 1;
	if (scale)
		scale_factor = scale->getUniqueInteger().getZExtValue();
	if (scale_log2)
		scale_factor = 1ull << scale_factor;

	int64_t bias_factor = 0;
	if (bias)
		bias_factor = bias->getUniqueInteger().getSExtValue();
	if (bias_negate)
		bias_factor = -bias_factor;

	// If there is no bit overlap between scale_factor and bias_factor
	// then the bitwise OR is equivalent to add.
	if (!bias_is_add && (scale_factor & bias_factor) != 0)
		return false;

	scale_factor *= stride;
	bias_factor *= stride;

	if (scale_factor % element_size == 0 && bias_factor % element_size == 0 && index)
	{
		split.scale = scale_factor / element_size;
		split.bias = bias_factor / int(element_size);
		split.dynamic_index = index;
		return true;
	}
	else
		return false;
}